

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::unShift(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  undefined8 *puVar1;
  uint *puVar2;
  uint *puVar3;
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  pointer pnVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  type_conflict5 tVar15;
  bool bVar16;
  int iVar17;
  SPxOut *pSVar18;
  Status **ppSVar19;
  cpp_dec_float<100U,_int,_void> *pcVar20;
  cpp_dec_float<100U,_int,_void> *pcVar21;
  long lVar22;
  ulong uVar23;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  uint local_1d8 [9];
  bool bStack_1b4;
  undefined8 local_1b0;
  cpp_dec_float<100U,_int,_void> *local_1a0;
  cpp_dec_float<100U,_int,_void> local_198;
  cpp_dec_float<100U,_int,_void> local_148;
  ulong local_f0;
  cpp_dec_float<100U,_int,_void> local_e8;
  Status **local_90;
  Status **local_88;
  cpp_dec_float<100U,_int,_void> local_80;
  
  pSVar18 = this->spxout;
  if ((pSVar18 != (SPxOut *)0x0) &&
     (local_198.data._M_elems[0] = pSVar18->m_verbosity, 4 < (int)local_198.data._M_elems[0])) {
    local_148.data._M_elems[0] = 5;
    (*pSVar18->_vptr_SPxOut[2])();
    pSVar18 = soplex::operator<<(this->spxout,"DSHIFT07 = ");
    pSVar18 = soplex::operator<<(pSVar18,"unshifting ...");
    std::endl<char,std::char_traits<char>>(pSVar18->m_streams[pSVar18->m_verbosity]);
    (*this->spxout->_vptr_SPxOut[2])();
  }
  if (this->initialized == true) {
    local_198.fpclass = cpp_dec_float_finite;
    local_198.prec_elem = 0x10;
    local_198.data._M_elems[0] = 0;
    local_198.data._M_elems[1] = 0;
    local_198.data._M_elems[2] = 0;
    local_198.data._M_elems[3] = 0;
    local_198.data._M_elems[4] = 0;
    local_198.data._M_elems[5] = 0;
    local_198.data._M_elems[6] = 0;
    local_198.data._M_elems[7] = 0;
    local_198.data._M_elems[8] = 0;
    local_198.data._M_elems[9] = 0;
    local_198.data._M_elems[10] = 0;
    local_198.data._M_elems[0xb] = 0;
    local_198.data._M_elems[0xc] = 0;
    local_198.data._M_elems[0xd] = 0;
    local_198.data._M_elems._56_5_ = 0;
    local_198.data._M_elems[0xf]._1_3_ = 0;
    local_198.exp = 0;
    local_198.neg = false;
    local_148.fpclass = cpp_dec_float_finite;
    local_148.prec_elem = 0x10;
    local_148.data._M_elems[0] = 0;
    local_148.data._M_elems[1] = 0;
    local_148.data._M_elems[2] = 0;
    local_148.data._M_elems[3] = 0;
    local_148.data._M_elems[4] = 0;
    local_148.data._M_elems[5] = 0;
    local_148.data._M_elems[6] = 0;
    local_148.data._M_elems[7] = 0;
    local_148.data._M_elems[8] = 0;
    local_148.data._M_elems[9] = 0;
    local_148.data._M_elems[10] = 0;
    local_148.data._M_elems[0xb] = 0;
    local_148.data._M_elems[0xc] = 0;
    local_148.data._M_elems[0xd] = 0;
    local_148.data._M_elems._56_5_ = 0;
    local_148.data._M_elems[0xf]._1_3_ = 0;
    local_148.exp = 0;
    local_148.neg = false;
    local_1a0 = &(this->theShift).m_backend;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(local_1a0,0);
    if (this->theType == ENTER) {
      entertol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_80,this);
      uVar23 = (ulong)(uint)(this->thecovectors->set).thenum;
      if (this->theRep == COLUMN) {
        lVar22 = uVar23 * 0x50;
        while( true ) {
          if ((int)uVar23 < 1) break;
          local_e8.data._M_elems._0_8_ =
               (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).theBaseId.data[uVar23 - 1].super_DataKey;
          iVar17 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::number(&this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ,(SPxId *)&local_e8);
          if ((int)local_e8.data._M_elems[0] < 0) {
            pnVar6 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_198.data._M_elems[0] = pnVar6[iVar17].m_backend.data._M_elems[0];
            puVar2 = pnVar6[iVar17].m_backend.data._M_elems + 0xc;
            uVar7 = *(undefined8 *)(puVar2 + 2);
            local_1d8[4] = (uint)((ulong)*(undefined8 *)puVar2 >> 0x20);
            puVar2 = pnVar6[iVar17].m_backend.data._M_elems + 9;
            uVar8 = *(undefined8 *)puVar2;
            uVar9 = *(undefined8 *)(puVar2 + 2);
            local_1d8[3] = (uint)((ulong)uVar9 >> 0x20);
            local_198.data._M_elems[0xc] = local_1d8[3];
            puVar2 = pnVar6[iVar17].m_backend.data._M_elems + 5;
            uVar10 = *(undefined8 *)puVar2;
            uVar11 = *(undefined8 *)(puVar2 + 2);
            puVar2 = pnVar6[iVar17].m_backend.data._M_elems + 1;
            uVar12 = *(undefined8 *)puVar2;
            uVar13 = *(undefined8 *)(puVar2 + 2);
            local_198.exp = pnVar6[iVar17].m_backend.exp;
            local_198.fpclass = pnVar6[iVar17].m_backend.fpclass;
            local_198.prec_elem = pnVar6[iVar17].m_backend.prec_elem;
            local_198.neg =
                 (bool)((local_198.data._M_elems[0] != 0 ||
                        local_198.fpclass != cpp_dec_float_finite) ^ pnVar6[iVar17].m_backend.neg);
            local_198.data._M_elems[0xd] = local_1d8[4];
            local_198.data._M_elems._56_5_ = SUB85(uVar7,0);
            local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
            local_198.data._M_elems[9] = (uint)uVar8;
            local_198.data._M_elems[10] = (uint)((ulong)uVar8 >> 0x20);
            local_198.data._M_elems[0xb] = (uint)uVar9;
            local_198.data._M_elems[5] = (uint)uVar10;
            local_198.data._M_elems[6] = (uint)((ulong)uVar10 >> 0x20);
            local_198.data._M_elems[7] = (uint)uVar11;
            local_198.data._M_elems[8] = (uint)((ulong)uVar11 >> 0x20);
            local_198.data._M_elems[1] = (uint)uVar12;
            local_198.data._M_elems[2] = (uint)((ulong)uVar12 >> 0x20);
            local_198.data._M_elems[3] = (uint)uVar13;
            local_198.data._M_elems[4] = (uint)((ulong)uVar13 >> 0x20);
            pnVar6 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_148.data._M_elems[0] = pnVar6[iVar17].m_backend.data._M_elems[0];
            puVar2 = pnVar6[iVar17].m_backend.data._M_elems + 0xc;
            uVar7 = *(undefined8 *)(puVar2 + 2);
            local_1d8[4] = (uint)((ulong)*(undefined8 *)puVar2 >> 0x20);
            local_1d8[5] = (uint)uVar7;
            local_1d8[6] = (uint)((ulong)uVar7 >> 0x20);
            puVar2 = pnVar6[iVar17].m_backend.data._M_elems + 9;
            local_1d8._0_8_ = *(undefined8 *)puVar2;
            uVar8 = *(undefined8 *)(puVar2 + 2);
            local_1d8[2] = (uint)uVar8;
            local_1d8[3] = (uint)((ulong)uVar8 >> 0x20);
            puVar2 = pnVar6[iVar17].m_backend.data._M_elems + 5;
            local_1e8 = *(undefined1 (*) [16])puVar2;
            puVar3 = pnVar6[iVar17].m_backend.data._M_elems + 1;
            local_1f8 = *(undefined1 (*) [16])puVar3;
            local_148.exp = pnVar6[iVar17].m_backend.exp;
            local_148.fpclass = pnVar6[iVar17].m_backend.fpclass;
            local_148.prec_elem = pnVar6[iVar17].m_backend.prec_elem;
            local_148.neg =
                 (bool)((local_148.fpclass != cpp_dec_float_finite ||
                        local_148.data._M_elems[0] != 0) ^ pnVar6[iVar17].m_backend.neg);
            local_148.data._M_elems[0xd] = local_1d8[4];
            local_148.data._M_elems._56_5_ = SUB85(uVar7,0);
            local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
            local_148.data._M_elems[9] = (uint)local_1d8._0_8_;
            local_148.data._M_elems[10] = SUB84(local_1d8._0_8_,4);
            local_148.data._M_elems[5] = (uint)*(undefined8 *)puVar2;
            local_148.data._M_elems[6] = (uint)((ulong)*(undefined8 *)puVar2 >> 0x20);
            local_148.data._M_elems[7] = (uint)*(undefined8 *)(puVar2 + 2);
            local_148.data._M_elems[8] = (uint)((ulong)*(undefined8 *)(puVar2 + 2) >> 0x20);
            local_148.data._M_elems[1] = (uint)*(undefined8 *)puVar3;
            local_148.data._M_elems[2] = (uint)((ulong)*(undefined8 *)puVar3 >> 0x20);
            local_148.data._M_elems[3] = (uint)*(undefined8 *)(puVar3 + 2);
            local_148.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(puVar3 + 2) >> 0x20);
            local_148.data._M_elems[0xb] = local_1d8[2];
            local_148.data._M_elems[0xc] = local_1d8[3];
          }
          else {
            pnVar6 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar7 = *(undefined8 *)&pnVar6[iVar17].m_backend.data;
            uVar8 = *(undefined8 *)(pnVar6[iVar17].m_backend.data._M_elems + 2);
            puVar2 = pnVar6[iVar17].m_backend.data._M_elems + 4;
            uVar9 = *(undefined8 *)puVar2;
            uVar10 = *(undefined8 *)(puVar2 + 2);
            puVar2 = pnVar6[iVar17].m_backend.data._M_elems + 8;
            uVar11 = *(undefined8 *)puVar2;
            uVar12 = *(undefined8 *)(puVar2 + 2);
            puVar2 = pnVar6[iVar17].m_backend.data._M_elems + 0xc;
            uVar13 = *(undefined8 *)puVar2;
            uVar14 = *(undefined8 *)(puVar2 + 2);
            local_198.data._M_elems[0xc] = (uint)uVar13;
            local_198.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
            local_198.data._M_elems._56_5_ = SUB85(uVar14,0);
            local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            local_198.data._M_elems[8] = (uint)uVar11;
            local_198.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
            local_198.data._M_elems[10] = (uint)uVar12;
            local_198.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
            local_198.data._M_elems[4] = (uint)uVar9;
            local_198.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_198.data._M_elems[6] = (uint)uVar10;
            local_198.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            local_198.data._M_elems[0] = (uint)uVar7;
            local_198.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
            local_198.data._M_elems[2] = (uint)uVar8;
            local_198.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_198.exp = pnVar6[iVar17].m_backend.exp;
            local_198.neg = pnVar6[iVar17].m_backend.neg;
            local_198.fpclass = pnVar6[iVar17].m_backend.fpclass;
            local_198.prec_elem = pnVar6[iVar17].m_backend.prec_elem;
            pnVar6 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar7 = *(undefined8 *)&pnVar6[iVar17].m_backend.data;
            uVar8 = *(undefined8 *)(pnVar6[iVar17].m_backend.data._M_elems + 2);
            puVar2 = pnVar6[iVar17].m_backend.data._M_elems + 4;
            uVar9 = *(undefined8 *)puVar2;
            uVar10 = *(undefined8 *)(puVar2 + 2);
            puVar2 = pnVar6[iVar17].m_backend.data._M_elems + 8;
            uVar11 = *(undefined8 *)puVar2;
            uVar12 = *(undefined8 *)(puVar2 + 2);
            puVar2 = pnVar6[iVar17].m_backend.data._M_elems + 0xc;
            uVar13 = *(undefined8 *)puVar2;
            uVar14 = *(undefined8 *)(puVar2 + 2);
            local_148.data._M_elems[0xc] = (uint)uVar13;
            local_148.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
            local_148.data._M_elems._56_5_ = SUB85(uVar14,0);
            local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            local_148.data._M_elems[8] = (uint)uVar11;
            local_148.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
            local_148.data._M_elems[10] = (uint)uVar12;
            local_148.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
            local_148.data._M_elems[4] = (uint)uVar9;
            local_148.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_148.data._M_elems[6] = (uint)uVar10;
            local_148.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            local_148.data._M_elems[0] = (uint)uVar7;
            local_148.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
            local_148.data._M_elems[2] = (uint)uVar8;
            local_148.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_148.exp = pnVar6[iVar17].m_backend.exp;
            local_148.neg = pnVar6[iVar17].m_backend.neg;
            local_148.fpclass = pnVar6[iVar17].m_backend.fpclass;
            local_148.prec_elem = pnVar6[iVar17].m_backend.prec_elem;
          }
          bVar16 = boost::multiprecision::operator!=
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_198,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_148);
          if (bVar16) {
            pnVar6 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = (undefined1  [16])0x0;
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1d8[2] = 0;
            local_1d8[3] = 0;
            local_1d8[4] = 0;
            local_1d8[5] = 0;
            local_1d8[6] = 0;
            local_1d8[7] = 0;
            local_1d8[8] = 0;
            bStack_1b4 = false;
            local_f0 = uVar23;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_198,&local_80);
            tVar15 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar6[0xffffffffffffffff].m_backend.data._M_elems +
                                   lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_1f8);
            if (tVar15) {
              pnVar6 = (this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
              *puVar1 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
              puVar1[1] = CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_
                                  );
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
              *puVar1 = CONCAT44(local_198.data._M_elems[9],local_198.data._M_elems[8]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[0xb],local_198.data._M_elems[10]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
              *puVar1 = CONCAT44(local_198.data._M_elems[5],local_198.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[7],local_198.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
              *puVar1 = CONCAT44(local_198.data._M_elems[1],local_198.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[3],local_198.data._M_elems[2]);
              *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_198.exp;
              *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) = local_198.neg;
              *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                   local_198._72_8_;
            }
            else {
              tVar15 = boost::multiprecision::operator>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)(this->theFvec->
                                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start
                                            [0xffffffffffffffff].m_backend.data._M_elems + lVar22),
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_198);
              if (tVar15) {
                local_1b0._0_4_ = cpp_dec_float_finite;
                local_1b0._4_4_ = 0x10;
                local_1f8 = (undefined1  [16])0x0;
                local_1e8 = (undefined1  [16])0x0;
                local_1d8[0] = 0;
                local_1d8[1] = 0;
                local_1d8[2] = 0;
                local_1d8[3] = 0;
                local_1d8[4] = 0;
                local_1d8[5] = 0;
                local_1d8[6] = 0;
                local_1d8[7] = 0;
                local_1d8[8] = 0;
                bStack_1b4 = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                          ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                           (cpp_dec_float<100U,_int,_void> *)
                           ((long)(this->theUBbound).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                  _M_elems + lVar22),&local_198);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
              }
            }
            pnVar6 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = (undefined1  [16])0x0;
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1d8[2] = 0;
            local_1d8[3] = 0;
            local_1d8[4] = 0;
            local_1d8[5] = 0;
            local_1d8[6] = 0;
            local_1d8[7] = 0;
            local_1d8[8] = 0;
            bStack_1b4 = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_148,&local_80);
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar6[0xffffffffffffffff].m_backend.data._M_elems +
                                   lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_1f8);
            if (tVar15) {
              pnVar6 = (this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
              *puVar1 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
              puVar1[1] = CONCAT35(local_148.data._M_elems[0xf]._1_3_,local_148.data._M_elems._56_5_
                                  );
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
              *puVar1 = CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
              *puVar1 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
              *puVar1 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
              *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_148.exp;
              *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) = local_148.neg;
              *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                   local_148._72_8_;
              uVar23 = local_f0;
            }
            else {
              tVar15 = boost::multiprecision::operator<
                                 ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)(this->theFvec->
                                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start
                                            [0xffffffffffffffff].m_backend.data._M_elems + lVar22),
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_148);
              uVar23 = local_f0;
              if (tVar15) {
                local_1b0._0_4_ = cpp_dec_float_finite;
                local_1b0._4_4_ = 0x10;
                local_1f8 = (undefined1  [16])0x0;
                local_1e8 = (undefined1  [16])0x0;
                local_1d8[0] = 0;
                local_1d8[1] = 0;
                local_1d8[2] = 0;
                local_1d8[3] = 0;
                local_1d8[4] = 0;
                local_1d8[5] = 0;
                local_1d8[6] = 0;
                local_1d8[7] = 0;
                local_1d8[8] = 0;
                bStack_1b4 = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                          ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                           (cpp_dec_float<100U,_int,_void> *)
                           ((long)(this->theLBbound).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                  _M_elems + lVar22),&local_148);
                uVar23 = local_f0;
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
              }
            }
          }
          else {
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theUBbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_198);
            if (tVar15) {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theUBbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22),&local_198);
            }
            else {
              tVar15 = boost::multiprecision::operator<
                                 ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)(this->theLBbound).val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                            data._M_elems + lVar22),
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_148);
              if (!tVar15) goto LAB_002ddc09;
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_148,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theLBbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22));
            }
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
          }
LAB_002ddc09:
          uVar23 = uVar23 - 1;
          lVar22 = lVar22 + -0x50;
        }
        uVar23 = (ulong)(uint)(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
        lVar22 = uVar23 * 0x50;
        for (; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
          if (this->theRep *
              (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.rowstat.data[uVar23 - 1] < 1) {
            pnVar6 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_198.data._M_elems[0] =
                 *(uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
            uVar7 = puVar1[1];
            local_1d8[4] = (uint)((ulong)*puVar1 >> 0x20);
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x24);
            uVar8 = *puVar1;
            uVar9 = puVar1[1];
            local_1d8[3] = (uint)((ulong)uVar9 >> 0x20);
            local_198.data._M_elems[0xc] = local_1d8[3];
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x14);
            uVar10 = *puVar1;
            uVar11 = puVar1[1];
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 4);
            uVar12 = *puVar1;
            uVar13 = puVar1[1];
            local_198._72_8_ = *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U)
            ;
            local_198.neg =
                 (bool)((local_198.data._M_elems[0] != 0 ||
                        local_198.fpclass != cpp_dec_float_finite) ^
                       *(byte *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U));
            local_198.exp = *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22);
            local_198.data._M_elems[0xd] = local_1d8[4];
            local_198.data._M_elems._56_5_ = SUB85(uVar7,0);
            local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
            local_198.data._M_elems[9] = (uint)uVar8;
            local_198.data._M_elems[10] = (uint)((ulong)uVar8 >> 0x20);
            local_198.data._M_elems[0xb] = (uint)uVar9;
            local_198.data._M_elems[5] = (uint)uVar10;
            local_198.data._M_elems[6] = (uint)((ulong)uVar10 >> 0x20);
            local_198.data._M_elems[7] = (uint)uVar11;
            local_198.data._M_elems[8] = (uint)((ulong)uVar11 >> 0x20);
            local_198.data._M_elems[1] = (uint)uVar12;
            local_198.data._M_elems[2] = (uint)((ulong)uVar12 >> 0x20);
            local_198.data._M_elems[3] = (uint)uVar13;
            local_198.data._M_elems[4] = (uint)((ulong)uVar13 >> 0x20);
            pnVar6 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_148.data._M_elems[0] =
                 *(uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
            uVar7 = puVar1[1];
            local_1d8[4] = (uint)((ulong)*puVar1 >> 0x20);
            local_1d8[5] = (uint)uVar7;
            local_1d8[6] = (uint)((ulong)uVar7 >> 0x20);
            puVar2 = (uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x24);
            local_1d8._0_8_ = *(undefined8 *)puVar2;
            uVar8 = *(undefined8 *)(puVar2 + 2);
            local_1d8[2] = (uint)uVar8;
            local_1d8[3] = (uint)((ulong)uVar8 >> 0x20);
            pauVar4 = (undefined1 (*) [16])
                      ((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x14);
            local_1e8 = *pauVar4;
            pauVar5 = (undefined1 (*) [16])((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 4);
            local_1f8 = *pauVar5;
            local_148.exp = *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22);
            local_148._72_8_ = *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U)
            ;
            local_148.neg =
                 (bool)((local_148.data._M_elems[0] != 0 ||
                        local_148.fpclass != cpp_dec_float_finite) ^
                       *(byte *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U));
            local_148.data._M_elems[0xd] = local_1d8[4];
            local_148.data._M_elems._56_5_ = SUB85(uVar7,0);
            local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
            local_148.data._M_elems[9] = (uint)local_1d8._0_8_;
            local_148.data._M_elems[10] = SUB84(local_1d8._0_8_,4);
            local_148.data._M_elems[5] = (uint)*(undefined8 *)*pauVar4;
            local_148.data._M_elems[6] = (uint)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
            local_148.data._M_elems[7] = (uint)*(undefined8 *)(*pauVar4 + 8);
            local_148.data._M_elems[8] = (uint)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
            local_148.data._M_elems[1] = (uint)*(undefined8 *)*pauVar5;
            local_148.data._M_elems[2] = (uint)((ulong)*(undefined8 *)*pauVar5 >> 0x20);
            local_148.data._M_elems[3] = (uint)*(undefined8 *)(*pauVar5 + 8);
            local_148.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(*pauVar5 + 8) >> 0x20);
            local_148.data._M_elems[0xb] = local_1d8[2];
            local_148.data._M_elems[0xc] = local_1d8[3];
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theURbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_198);
            if (tVar15) {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theURbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22),&local_198);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_148,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theLRbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22));
            if (tVar15) {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_148,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theLRbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22));
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
          }
          lVar22 = lVar22 + -0x50;
        }
        uVar23 = (ulong)(uint)(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
        lVar22 = uVar23 * 0x50;
        for (; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
          if (this->theRep *
              (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data[uVar23 - 1] < 1) {
            pnVar6 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
            uVar7 = *puVar1;
            uVar8 = puVar1[1];
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
            uVar9 = *puVar1;
            uVar10 = puVar1[1];
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
            uVar11 = *puVar1;
            uVar12 = puVar1[1];
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
            uVar13 = *puVar1;
            uVar14 = puVar1[1];
            local_198.data._M_elems[0xc] = (uint)uVar13;
            local_198.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
            local_198.data._M_elems._56_5_ = SUB85(uVar14,0);
            local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            local_198.data._M_elems[8] = (uint)uVar11;
            local_198.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
            local_198.data._M_elems[10] = (uint)uVar12;
            local_198.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
            local_198.data._M_elems[4] = (uint)uVar9;
            local_198.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_198.data._M_elems[6] = (uint)uVar10;
            local_198.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            local_198.data._M_elems[0] = (uint)uVar7;
            local_198.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
            local_198.data._M_elems[2] = (uint)uVar8;
            local_198.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_198.exp = *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22);
            local_198.neg = *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U);
            local_198._72_8_ = *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U)
            ;
            pnVar6 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
            uVar7 = *puVar1;
            uVar8 = puVar1[1];
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
            uVar9 = *puVar1;
            uVar10 = puVar1[1];
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
            uVar11 = *puVar1;
            uVar12 = puVar1[1];
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
            uVar13 = *puVar1;
            uVar14 = puVar1[1];
            local_148.data._M_elems[0xc] = (uint)uVar13;
            local_148.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
            local_148.data._M_elems._56_5_ = SUB85(uVar14,0);
            local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
            local_148.data._M_elems[8] = (uint)uVar11;
            local_148.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
            local_148.data._M_elems[10] = (uint)uVar12;
            local_148.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
            local_148.data._M_elems[4] = (uint)uVar9;
            local_148.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
            local_148.data._M_elems[6] = (uint)uVar10;
            local_148.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
            local_148.data._M_elems[0] = (uint)uVar7;
            local_148.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
            local_148.data._M_elems[2] = (uint)uVar8;
            local_148.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
            local_148.exp = *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22);
            local_148.neg = *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U);
            local_148._72_8_ = *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U)
            ;
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theUCbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_198);
            if (tVar15) {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theUCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22),&local_198);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_148,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theLCbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22));
            if (tVar15) {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_148,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theLCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22));
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
          }
          lVar22 = lVar22 + -0x50;
        }
      }
      else {
        local_88 = &(this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.colstat.data;
        local_90 = &(this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.rowstat.data;
        lVar22 = uVar23 * 0x50;
        while( true ) {
          if ((int)uVar23 < 1) break;
          local_e8.data._M_elems._0_8_ =
               (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).theBaseId.data[uVar23 - 1].super_DataKey;
          iVar17 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::number(&this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ,(SPxId *)&local_e8);
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(&local_148,0);
          local_198.data._M_elems[0] = local_148.data._M_elems[0];
          local_198.data._M_elems[1] = local_148.data._M_elems[1];
          local_198.data._M_elems[2] = local_148.data._M_elems[2];
          local_198.data._M_elems[3] = local_148.data._M_elems[3];
          local_198.data._M_elems[4] = local_148.data._M_elems[4];
          local_198.data._M_elems[5] = local_148.data._M_elems[5];
          local_198.data._M_elems[6] = local_148.data._M_elems[6];
          local_198.data._M_elems[7] = local_148.data._M_elems[7];
          local_198.data._M_elems[8] = local_148.data._M_elems[8];
          local_198.data._M_elems[9] = local_148.data._M_elems[9];
          local_198.data._M_elems[10] = local_148.data._M_elems[10];
          local_198.data._M_elems[0xb] = local_148.data._M_elems[0xb];
          local_198.data._M_elems[0xc] = local_148.data._M_elems[0xc];
          local_198.data._M_elems[0xd] = local_148.data._M_elems[0xd];
          local_198.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
          local_198.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
          local_198.exp = local_148.exp;
          local_198.neg = local_148.neg;
          local_198.fpclass = local_148.fpclass;
          local_198.prec_elem = local_148.prec_elem;
          ppSVar19 = local_88;
          if ((int)local_e8.data._M_elems[0] < 0) {
            ppSVar19 = local_90;
          }
          clearDualBounds(this,(*ppSVar19)[iVar17],
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_198,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_148);
          bVar16 = boost::multiprecision::operator!=
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)(this->theUBbound).val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data
                                        ._M_elems + lVar22),
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)(this->theLBbound).val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data
                                        ._M_elems + lVar22));
          if (bVar16) {
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theUBbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_198);
            if (tVar15) {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theUBbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22),&local_198);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
            else {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theUBbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22),&local_198);
LAB_002df306:
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
          }
          else {
            pnVar6 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = (undefined1  [16])0x0;
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1d8[2] = 0;
            local_1d8[3] = 0;
            local_1d8[4] = 0;
            local_1d8[5] = 0;
            local_1d8[6] = 0;
            local_1d8[7] = 0;
            local_1d8[8] = 0;
            bStack_1b4 = false;
            local_f0 = uVar23;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_198,&local_80);
            tVar15 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar6[0xffffffffffffffff].m_backend.data._M_elems +
                                   lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_1f8);
            if (tVar15) {
              pnVar6 = (this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
              *puVar1 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
              puVar1[1] = CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_
                                  );
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
              *puVar1 = CONCAT44(local_198.data._M_elems[9],local_198.data._M_elems[8]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[0xb],local_198.data._M_elems[10]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
              *puVar1 = CONCAT44(local_198.data._M_elems[5],local_198.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[7],local_198.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
              *puVar1 = CONCAT44(local_198.data._M_elems[1],local_198.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[3],local_198.data._M_elems[2]);
              *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_198.exp;
              *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) = local_198.neg;
              *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                   local_198._72_8_;
            }
            else {
              tVar15 = boost::multiprecision::operator>
                                 ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)(this->theFvec->
                                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start
                                            [0xffffffffffffffff].m_backend.data._M_elems + lVar22),
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_198);
              if (tVar15) {
                local_1b0._0_4_ = cpp_dec_float_finite;
                local_1b0._4_4_ = 0x10;
                local_1f8 = (undefined1  [16])0x0;
                local_1e8 = (undefined1  [16])0x0;
                local_1d8[0] = 0;
                local_1d8[1] = 0;
                local_1d8[2] = 0;
                local_1d8[3] = 0;
                local_1d8[4] = 0;
                local_1d8[5] = 0;
                local_1d8[6] = 0;
                local_1d8[7] = 0;
                local_1d8[8] = 0;
                bStack_1b4 = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                          ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                           (cpp_dec_float<100U,_int,_void> *)
                           ((long)(this->theUBbound).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                  _M_elems + lVar22),&local_198);
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                          (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
              }
            }
            pnVar6 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = (undefined1  [16])0x0;
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1d8[2] = 0;
            local_1d8[3] = 0;
            local_1d8[4] = 0;
            local_1d8[5] = 0;
            local_1d8[6] = 0;
            local_1d8[7] = 0;
            local_1d8[8] = 0;
            bStack_1b4 = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_148,&local_80);
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar6[0xffffffffffffffff].m_backend.data._M_elems +
                                   lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_1f8);
            if (tVar15) {
              pnVar6 = (this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
              *puVar1 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
              puVar1[1] = CONCAT35(local_148.data._M_elems[0xf]._1_3_,local_148.data._M_elems._56_5_
                                  );
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
              *puVar1 = CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
              *puVar1 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
              *puVar1 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
              *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_148.exp;
              *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) = local_148.neg;
              *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                   local_148._72_8_;
              uVar23 = local_f0;
            }
            else {
              tVar15 = boost::multiprecision::operator<
                                 ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)(this->theFvec->
                                            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            ).val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start
                                            [0xffffffffffffffff].m_backend.data._M_elems + lVar22),
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_148);
              uVar23 = local_f0;
              if (tVar15) {
                local_1b0._0_4_ = cpp_dec_float_finite;
                local_1b0._4_4_ = 0x10;
                local_1f8 = (undefined1  [16])0x0;
                local_1e8 = (undefined1  [16])0x0;
                local_1d8[0] = 0;
                local_1d8[1] = 0;
                local_1d8[2] = 0;
                local_1d8[3] = 0;
                local_1d8[4] = 0;
                local_1d8[5] = 0;
                local_1d8[6] = 0;
                local_1d8[7] = 0;
                local_1d8[8] = 0;
                bStack_1b4 = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                          ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                           (cpp_dec_float<100U,_int,_void> *)
                           ((long)(this->theLBbound).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                  _M_elems + lVar22),&local_148);
                uVar23 = local_f0;
                goto LAB_002df306;
              }
            }
          }
          uVar23 = uVar23 - 1;
          lVar22 = lVar22 + -0x50;
        }
        uVar23 = (ulong)(uint)(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
        lVar22 = uVar23 * 0x50;
        for (; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
          if (this->theRep *
              (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.rowstat.data[uVar23 - 1] < 1) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(&local_148,0)
            ;
            local_198.data._M_elems[0] = local_148.data._M_elems[0];
            local_198.data._M_elems[1] = local_148.data._M_elems[1];
            local_198.data._M_elems[2] = local_148.data._M_elems[2];
            local_198.data._M_elems[3] = local_148.data._M_elems[3];
            local_198.data._M_elems[4] = local_148.data._M_elems[4];
            local_198.data._M_elems[5] = local_148.data._M_elems[5];
            local_198.data._M_elems[6] = local_148.data._M_elems[6];
            local_198.data._M_elems[7] = local_148.data._M_elems[7];
            local_198.data._M_elems[8] = local_148.data._M_elems[8];
            local_198.data._M_elems[9] = local_148.data._M_elems[9];
            local_198.data._M_elems[10] = local_148.data._M_elems[10];
            local_198.data._M_elems[0xb] = local_148.data._M_elems[0xb];
            local_198.data._M_elems[0xc] = local_148.data._M_elems[0xc];
            local_198.data._M_elems[0xd] = local_148.data._M_elems[0xd];
            local_198.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
            local_198.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
            local_198.exp = local_148.exp;
            local_198.neg = local_148.neg;
            local_198.fpclass = local_148.fpclass;
            local_198.prec_elem = local_148.prec_elem;
            clearDualBounds(this,(this->
                                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thedesc.rowstat.data[uVar23 - 1],
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_198,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_148);
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theURbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_198);
            if (tVar15) {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theURbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22),&local_198);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_148,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theLRbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22));
            if (tVar15) {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_148,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theLRbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22));
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
          }
          lVar22 = lVar22 + -0x50;
        }
        uVar23 = (ulong)(uint)(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
        lVar22 = uVar23 * 0x50;
        for (; 0 < (int)uVar23; uVar23 = uVar23 - 1) {
          if (this->theRep *
              (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data[uVar23 - 1] < 1) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(&local_148,0)
            ;
            local_198.data._M_elems[0] = local_148.data._M_elems[0];
            local_198.data._M_elems[1] = local_148.data._M_elems[1];
            local_198.data._M_elems[2] = local_148.data._M_elems[2];
            local_198.data._M_elems[3] = local_148.data._M_elems[3];
            local_198.data._M_elems[4] = local_148.data._M_elems[4];
            local_198.data._M_elems[5] = local_148.data._M_elems[5];
            local_198.data._M_elems[6] = local_148.data._M_elems[6];
            local_198.data._M_elems[7] = local_148.data._M_elems[7];
            local_198.data._M_elems[8] = local_148.data._M_elems[8];
            local_198.data._M_elems[9] = local_148.data._M_elems[9];
            local_198.data._M_elems[10] = local_148.data._M_elems[10];
            local_198.data._M_elems[0xb] = local_148.data._M_elems[0xb];
            local_198.data._M_elems[0xc] = local_148.data._M_elems[0xc];
            local_198.data._M_elems[0xd] = local_148.data._M_elems[0xd];
            local_198.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
            local_198.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
            local_198.exp = local_148.exp;
            local_198.neg = local_148.neg;
            local_198.fpclass = local_148.fpclass;
            local_198.prec_elem = local_148.prec_elem;
            clearDualBounds(this,(this->
                                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thedesc.colstat.data[uVar23 - 1],
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_198,
                            (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_148);
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theUCbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_198);
            if (tVar15) {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theUCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22),&local_198);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_148,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theLCbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22));
            if (tVar15) {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_148,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theLCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22));
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
          }
          lVar22 = lVar22 + -0x50;
        }
      }
    }
    else {
      leavetol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_80,this);
      uVar23 = (ulong)(uint)(this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum;
      if (this->theRep == COLUMN) {
        lVar22 = uVar23 * 0x50;
        while( true ) {
          pcVar21 = &local_148;
          pcVar20 = &local_198;
          if ((int)uVar23 < 1) break;
          pnVar6 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .object.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
          uVar7 = *puVar1;
          uVar8 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
          uVar9 = *puVar1;
          uVar10 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
          uVar11 = *puVar1;
          uVar12 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
          uVar13 = *puVar1;
          uVar14 = puVar1[1];
          local_148.data._M_elems[0xc] = (uint)uVar13;
          local_148.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
          local_148.data._M_elems._56_5_ = SUB85(uVar14,0);
          local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
          local_148.data._M_elems[8] = (uint)uVar11;
          local_148.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
          local_148.data._M_elems[10] = (uint)uVar12;
          local_148.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
          local_148.data._M_elems[4] = (uint)uVar9;
          local_148.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
          local_148.data._M_elems[6] = (uint)uVar10;
          local_148.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
          local_148.data._M_elems[0] = (uint)uVar7;
          local_148.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
          local_148.data._M_elems[2] = (uint)uVar8;
          local_148.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
          local_198.exp = *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22);
          local_198.neg = *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U);
          local_148.fpclass =
               *(fpclass_type *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U);
          local_148.prec_elem = *(int32_t *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 0xcU)
          ;
          local_198.prec_elem = local_148.prec_elem;
          local_198.fpclass = local_148.fpclass;
          local_198.data._M_elems[0] = local_148.data._M_elems[0];
          local_198.data._M_elems[1] = local_148.data._M_elems[1];
          local_198.data._M_elems[2] = local_148.data._M_elems[2];
          local_198.data._M_elems[3] = local_148.data._M_elems[3];
          local_198.data._M_elems[4] = local_148.data._M_elems[4];
          local_198.data._M_elems[5] = local_148.data._M_elems[5];
          local_198.data._M_elems[6] = local_148.data._M_elems[6];
          local_198.data._M_elems[7] = local_148.data._M_elems[7];
          local_198.data._M_elems[8] = local_148.data._M_elems[8];
          local_198.data._M_elems[9] = local_148.data._M_elems[9];
          local_198.data._M_elems[10] = local_148.data._M_elems[10];
          local_198.data._M_elems[0xb] = local_148.data._M_elems[0xb];
          local_198.data._M_elems[0xc] = local_148.data._M_elems[0xc];
          local_198.data._M_elems[0xd] = local_148.data._M_elems[0xd];
          local_198.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
          local_198.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
          local_148.exp = local_198.exp;
          local_148.neg = local_198.neg;
          clearDualBounds(this,(this->
                               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).thedesc.rowstat.data[uVar23 - 1],
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)pcVar20,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)pcVar21);
          if (this->theRep *
              (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.rowstat.data[uVar23 - 1] < 1) {
            pnVar6 = (this->theCoPvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = (undefined1  [16])0x0;
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1d8[2] = 0;
            local_1d8[3] = 0;
            local_1d8[4] = 0;
            local_1d8[5] = 0;
            local_1d8[6] = 0;
            local_1d8[7] = 0;
            local_1d8[8] = 0;
            bStack_1b4 = false;
            local_f0 = uVar23;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,pcVar20,&local_80);
            tVar15 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar6[0xffffffffffffffff].m_backend.data._M_elems +
                                   lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_1f8);
            if (tVar15) {
              pnVar6 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
              *puVar1 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
              puVar1[1] = CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_
                                  );
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
              *puVar1 = CONCAT44(local_198.data._M_elems[9],local_198.data._M_elems[8]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[0xb],local_198.data._M_elems[10]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
              *puVar1 = CONCAT44(local_198.data._M_elems[5],local_198.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[7],local_198.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
              *puVar1 = CONCAT44(local_198.data._M_elems[1],local_198.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[3],local_198.data._M_elems[2]);
              *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_198.exp;
              *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) = local_198.neg;
              *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                   local_198._72_8_;
              bVar16 = boost::multiprecision::operator==
                                 ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)pcVar20,
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_148);
              if (bVar16) {
                pnVar6 = (this->theLRbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
                *puVar1 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
                puVar1[1] = CONCAT35(local_148.data._M_elems[0xf]._1_3_,
                                     local_148.data._M_elems._56_5_);
                puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
                *puVar1 = CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
                puVar1[1] = CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
                puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
                *puVar1 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
                puVar1[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
                puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
                *puVar1 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
                puVar1[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
                *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_148.exp;
                *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) = local_148.neg;
                *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                     local_148._72_8_;
              }
            }
            else {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theURbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22),pcVar20);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
            pnVar6 = (this->theCoPvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = (undefined1  [16])0x0;
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1d8[2] = 0;
            local_1d8[3] = 0;
            local_1d8[4] = 0;
            local_1d8[5] = 0;
            local_1d8[6] = 0;
            local_1d8[7] = 0;
            local_1d8[8] = 0;
            bStack_1b4 = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_148,&local_80);
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar6[0xffffffffffffffff].m_backend.data._M_elems +
                                   lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_1f8);
            uVar23 = local_f0;
            if (tVar15) {
              pnVar6 = (this->theLRbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
              *puVar1 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
              puVar1[1] = CONCAT35(local_148.data._M_elems[0xf]._1_3_,local_148.data._M_elems._56_5_
                                  );
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
              *puVar1 = CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
              *puVar1 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
              *puVar1 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
              *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_148.exp;
              *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) = local_148.neg;
              *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                   local_148._72_8_;
              bVar16 = boost::multiprecision::operator==
                                 ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_198,
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_148);
              if (bVar16) {
                pnVar6 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
                *puVar1 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
                puVar1[1] = CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                     local_198.data._M_elems._56_5_);
                puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
                *puVar1 = CONCAT44(local_198.data._M_elems[9],local_198.data._M_elems[8]);
                puVar1[1] = CONCAT44(local_198.data._M_elems[0xb],local_198.data._M_elems[10]);
                puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
                *puVar1 = CONCAT44(local_198.data._M_elems[5],local_198.data._M_elems[4]);
                puVar1[1] = CONCAT44(local_198.data._M_elems[7],local_198.data._M_elems[6]);
                puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
                *puVar1 = CONCAT44(local_198.data._M_elems[1],local_198.data._M_elems[0]);
                puVar1[1] = CONCAT44(local_198.data._M_elems[3],local_198.data._M_elems[2]);
                *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_198.exp;
                *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) = local_198.neg;
                *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                     local_198._72_8_;
              }
            }
            else {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_148,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theLRbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22));
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
          }
          else {
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theURbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)pcVar20);
            if (tVar15) {
              pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)(this->theURbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar22);
            }
            else {
              tVar15 = boost::multiprecision::operator<
                                 ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)(this->theLRbound).val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                            data._M_elems + lVar22),
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)pcVar21);
              if (!tVar15) goto LAB_002dd5f3;
              pcVar20 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)(this->theLRbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar22);
            }
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            bStack_1b4 = false;
            local_1d8[8] = 0;
            local_1d8[7] = 0;
            local_1d8[6] = 0;
            local_1d8[5] = 0;
            local_1d8[4] = 0;
            local_1d8[3] = 0;
            local_1d8[2] = 0;
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1e8 = (undefined1  [16])0x0;
            local_1f8 = (undefined1  [16])0x0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,pcVar21,pcVar20);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
          }
LAB_002dd5f3:
          uVar23 = uVar23 - 1;
          lVar22 = lVar22 + -0x50;
        }
        uVar23 = (ulong)(uint)(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
        lVar22 = uVar23 * 0x50;
        while( true ) {
          if ((int)uVar23 < 1) break;
          pnVar6 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .object.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_198.data._M_elems[0] = *(uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
          uVar7 = puVar1[1];
          local_1d8[4] = (uint)((ulong)*puVar1 >> 0x20);
          local_1d8[5] = (uint)uVar7;
          local_1d8[6] = (uint)((ulong)uVar7 >> 0x20);
          puVar2 = (uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x24);
          local_1d8._0_8_ = *(undefined8 *)puVar2;
          uVar8 = *(undefined8 *)(puVar2 + 2);
          local_1d8[2] = (uint)uVar8;
          local_1d8[3] = (uint)((ulong)uVar8 >> 0x20);
          pauVar4 = (undefined1 (*) [16])((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x14);
          local_1e8 = *pauVar4;
          pauVar5 = (undefined1 (*) [16])((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 4);
          local_1f8 = *pauVar5;
          local_198.exp = *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22);
          local_148.fpclass =
               *(fpclass_type *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U);
          local_148.prec_elem = *(int32_t *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 0xcU)
          ;
          local_198.neg =
               (bool)((local_198.data._M_elems[0] != 0 || local_148.fpclass != cpp_dec_float_finite)
                     ^ *(byte *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U));
          local_148.data._M_elems[0xd] = local_1d8[4];
          local_148.data._M_elems._56_5_ = SUB85(uVar7,0);
          local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          local_148.data._M_elems[9] = (uint)local_1d8._0_8_;
          local_148.data._M_elems[10] = SUB84(local_1d8._0_8_,4);
          local_148.data._M_elems[5] = (uint)*(undefined8 *)*pauVar4;
          local_148.data._M_elems[6] = (uint)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
          local_148.data._M_elems[7] = (uint)*(undefined8 *)(*pauVar4 + 8);
          local_148.data._M_elems[8] = (uint)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
          local_148.data._M_elems[1] = (uint)*(undefined8 *)*pauVar5;
          local_148.data._M_elems[2] = (uint)((ulong)*(undefined8 *)*pauVar5 >> 0x20);
          local_148.data._M_elems[3] = (uint)*(undefined8 *)(*pauVar5 + 8);
          local_148.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(*pauVar5 + 8) >> 0x20);
          local_198.data._M_elems[3] = local_148.data._M_elems[3];
          local_198.data._M_elems[4] = local_148.data._M_elems[4];
          local_198.data._M_elems[5] = local_148.data._M_elems[5];
          local_198.data._M_elems[6] = local_148.data._M_elems[6];
          local_198.data._M_elems[7] = local_148.data._M_elems[7];
          local_198.data._M_elems[8] = local_148.data._M_elems[8];
          local_198.data._M_elems[9] = local_148.data._M_elems[9];
          local_198.data._M_elems[10] = local_148.data._M_elems[10];
          local_198.data._M_elems[0xb] = local_1d8[2];
          local_198.data._M_elems[0xc] = local_1d8[3];
          local_198.data._M_elems[0xd] = local_1d8[4];
          local_198.prec_elem = local_148.prec_elem;
          local_198.fpclass = local_148.fpclass;
          local_198.data._M_elems[1] = local_148.data._M_elems[1];
          local_198.data._M_elems[2] = local_148.data._M_elems[2];
          local_198.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
          local_198.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
          local_148.data._M_elems[0] = local_198.data._M_elems[0];
          local_148.data._M_elems[0xb] = local_1d8[2];
          local_148.data._M_elems[0xc] = local_1d8[3];
          local_148.exp = local_198.exp;
          local_148.neg = local_198.neg;
          clearDualBounds(this,(this->
                               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).thedesc.colstat.data[uVar23 - 1],
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_148,
                          (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_198);
          if (this->theRep *
              (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data[uVar23 - 1] < 1) {
            pnVar6 = (this->thePvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_e8.data._M_elems[1] = local_198.data._M_elems[1];
            local_e8.data._M_elems[0] = local_198.data._M_elems[0];
            local_e8.data._M_elems[3] = local_198.data._M_elems[3];
            local_e8.data._M_elems[2] = local_198.data._M_elems[2];
            local_e8.data._M_elems[5] = local_198.data._M_elems[5];
            local_e8.data._M_elems[4] = local_198.data._M_elems[4];
            local_e8.data._M_elems[7] = local_198.data._M_elems[7];
            local_e8.data._M_elems[6] = local_198.data._M_elems[6];
            local_e8.data._M_elems[9] = local_198.data._M_elems[9];
            local_e8.data._M_elems[8] = local_198.data._M_elems[8];
            local_e8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
            local_e8.data._M_elems[10] = local_198.data._M_elems[10];
            local_e8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
            local_e8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
            local_e8.data._M_elems[0xf]._1_3_ = local_198.data._M_elems[0xf]._1_3_;
            local_e8.data._M_elems._56_5_ = local_198.data._M_elems._56_5_;
            local_e8.exp = local_198.exp;
            local_e8.neg = local_198.neg;
            local_e8.fpclass = local_198.fpclass;
            local_e8.prec_elem = local_198.prec_elem;
            if (local_198.fpclass != cpp_dec_float_finite || local_198.data._M_elems[0] != 0) {
              local_e8.neg = (bool)(local_198.neg ^ 1);
            }
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            local_1f8 = ZEXT816(0);
            local_1e8 = ZEXT816(0);
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1d8[2] = 0;
            local_1d8[3] = 0;
            local_1d8[4] = 0;
            local_1d8[5] = 0;
            local_1d8[6] = 0;
            local_1d8[7] = 0;
            local_1d8[8] = 0;
            bStack_1b4 = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_e8,&local_80);
            tVar15 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar6[0xffffffffffffffff].m_backend.data._M_elems +
                                   lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_1f8);
            if (tVar15) {
              local_1f8._4_4_ = local_198.data._M_elems[2];
              local_1f8._0_4_ = local_198.data._M_elems[1];
              local_1f8._12_4_ = local_198.data._M_elems[4];
              local_1f8._8_4_ = local_198.data._M_elems[3];
              local_1e8._4_4_ = local_198.data._M_elems[6];
              local_1e8._0_4_ = local_198.data._M_elems[5];
              local_1e8._12_4_ = local_198.data._M_elems[8];
              local_1e8._8_4_ = local_198.data._M_elems[7];
              local_1d8[1] = local_198.data._M_elems[10];
              local_1d8[0] = local_198.data._M_elems[9];
              local_1d8[2] = local_198.data._M_elems[0xb];
              local_1d8[3] = local_198.data._M_elems[0xc];
              local_1d8[4] = local_198.data._M_elems[0xd];
              local_1d8[5] = local_198.data._M_elems[0xe];
              local_1d8[6] = (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                             local_198.data._M_elems._56_5_) >> 0x20);
              pnVar6 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22) =
                   local_198.data._M_elems[0];
              puVar2 = (uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 4);
              *(undefined8 *)puVar2 = local_1f8._0_8_;
              *(undefined8 *)(puVar2 + 2) = local_1f8._8_8_;
              puVar2 = (uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x14);
              *(undefined8 *)puVar2 = local_1e8._0_8_;
              *(undefined8 *)(puVar2 + 2) = local_1e8._8_8_;
              puVar2 = (uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x24);
              *(undefined8 *)puVar2 = local_1d8._0_8_;
              *(ulong *)(puVar2 + 2) =
                   CONCAT44(local_198.data._M_elems[0xc],local_198.data._M_elems[0xb]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
              *puVar1 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
              puVar1[1] = CONCAT44(local_1d8[6],local_1d8[5]);
              *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_198.exp;
              *(char *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) =
                   (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) ^
                   local_198.neg;
              *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                   local_198._72_8_;
              bVar16 = boost::multiprecision::operator==
                                 ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_198,
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_148);
              if (bVar16) {
                local_1d8[5] = local_148.data._M_elems[0xe];
                local_1d8[6] = (uint)(CONCAT35(local_148.data._M_elems[0xf]._1_3_,
                                               local_148.data._M_elems._56_5_) >> 0x20);
                pnVar6 = (this->theLCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22) =
                     local_148.data._M_elems[0];
                puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 4);
                *puVar1 = CONCAT44(local_148.data._M_elems[2],local_148.data._M_elems[1]);
                puVar1[1] = CONCAT44(local_148.data._M_elems[4],local_148.data._M_elems[3]);
                puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x14);
                *puVar1 = CONCAT44(local_148.data._M_elems[6],local_148.data._M_elems[5]);
                puVar1[1] = CONCAT44(local_148.data._M_elems[8],local_148.data._M_elems[7]);
                puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x24);
                *puVar1 = CONCAT44(local_148.data._M_elems[10],local_148.data._M_elems[9]);
                puVar1[1] = CONCAT44(local_148.data._M_elems[0xc],local_148.data._M_elems[0xb]);
                puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
                *puVar1 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
                puVar1[1] = CONCAT44(local_1d8[6],local_1d8[5]);
                *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_148.exp;
                *(char *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) =
                     (local_148.data._M_elems[0] != 0 || local_148.fpclass != cpp_dec_float_finite)
                     ^ local_148.neg;
                *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                     local_148._72_8_;
              }
            }
            else {
              local_e8.data._M_elems[1] = local_198.data._M_elems[1];
              local_e8.data._M_elems[0] = local_198.data._M_elems[0];
              local_e8.data._M_elems[3] = local_198.data._M_elems[3];
              local_e8.data._M_elems[2] = local_198.data._M_elems[2];
              local_e8.data._M_elems[5] = local_198.data._M_elems[5];
              local_e8.data._M_elems[4] = local_198.data._M_elems[4];
              local_e8.data._M_elems[7] = local_198.data._M_elems[7];
              local_e8.data._M_elems[6] = local_198.data._M_elems[6];
              local_e8.data._M_elems[9] = local_198.data._M_elems[9];
              local_e8.data._M_elems[8] = local_198.data._M_elems[8];
              local_e8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
              local_e8.data._M_elems[10] = local_198.data._M_elems[10];
              local_e8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
              local_e8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
              local_e8.data._M_elems[0xf]._1_3_ = local_198.data._M_elems[0xf]._1_3_;
              local_e8.data._M_elems._56_5_ = local_198.data._M_elems._56_5_;
              local_e8.exp = local_198.exp;
              local_e8.neg = local_198.neg;
              local_e8.fpclass = local_198.fpclass;
              local_e8.prec_elem = local_198.prec_elem;
              if (local_198.fpclass != cpp_dec_float_finite || local_198.data._M_elems[0] != 0) {
                local_e8.neg = (bool)(local_198.neg ^ 1);
              }
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8._0_4_ = 0;
              local_1f8._4_4_ = 0;
              local_1f8._8_4_ = 0;
              local_1f8._12_4_ = 0;
              local_1e8._0_4_ = 0;
              local_1e8._4_4_ = 0;
              local_1e8._8_4_ = 0;
              local_1e8._12_4_ = 0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theUCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22),&local_e8);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
            pnVar6 = (this->thePvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_e8.data._M_elems[1] = local_148.data._M_elems[1];
            local_e8.data._M_elems[0] = local_148.data._M_elems[0];
            local_e8.data._M_elems[3] = local_148.data._M_elems[3];
            local_e8.data._M_elems[2] = local_148.data._M_elems[2];
            local_e8.data._M_elems[5] = local_148.data._M_elems[5];
            local_e8.data._M_elems[4] = local_148.data._M_elems[4];
            local_e8.data._M_elems[7] = local_148.data._M_elems[7];
            local_e8.data._M_elems[6] = local_148.data._M_elems[6];
            local_e8.data._M_elems[9] = local_148.data._M_elems[9];
            local_e8.data._M_elems[8] = local_148.data._M_elems[8];
            local_e8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
            local_e8.data._M_elems[10] = local_148.data._M_elems[10];
            local_e8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
            local_e8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
            local_e8.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
            local_e8.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
            local_e8.exp = local_148.exp;
            local_e8.neg = local_148.neg;
            local_e8.fpclass = local_148.fpclass;
            local_e8.prec_elem = local_148.prec_elem;
            if (local_148.fpclass != cpp_dec_float_finite || local_148.data._M_elems[0] != 0) {
              local_e8.neg = (bool)(local_148.neg ^ 1);
            }
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            local_1f8 = ZEXT816(0);
            local_1e8 = ZEXT816(0);
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1d8[2] = 0;
            local_1d8[3] = 0;
            local_1d8[4] = 0;
            local_1d8[5] = 0;
            local_1d8[6] = 0;
            local_1d8[7] = 0;
            local_1d8[8] = 0;
            bStack_1b4 = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_e8,&local_80);
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar6[0xffffffffffffffff].m_backend.data._M_elems +
                                   lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_1f8);
            if (!tVar15) {
              local_e8.data._M_elems[1] = local_148.data._M_elems[1];
              local_e8.data._M_elems[0] = local_148.data._M_elems[0];
              local_e8.data._M_elems[3] = local_148.data._M_elems[3];
              local_e8.data._M_elems[2] = local_148.data._M_elems[2];
              local_e8.data._M_elems[5] = local_148.data._M_elems[5];
              local_e8.data._M_elems[4] = local_148.data._M_elems[4];
              local_e8.data._M_elems[7] = local_148.data._M_elems[7];
              local_e8.data._M_elems[6] = local_148.data._M_elems[6];
              local_e8.data._M_elems[9] = local_148.data._M_elems[9];
              local_e8.data._M_elems[8] = local_148.data._M_elems[8];
              local_e8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
              local_e8.data._M_elems[10] = local_148.data._M_elems[10];
              local_e8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
              local_e8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
              local_e8.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
              local_e8.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
              local_e8.exp = local_148.exp;
              local_e8.neg = local_148.neg;
              local_e8.fpclass = local_148.fpclass;
              local_e8.prec_elem = local_148.prec_elem;
              if (local_148.fpclass != cpp_dec_float_finite || local_148.data._M_elems[0] != 0) {
LAB_002de527:
                local_e8.neg = (bool)(local_148.neg ^ 1);
                local_e8.exp = local_148.exp;
                local_e8._72_8_ = local_148._72_8_;
              }
LAB_002de530:
              pcVar20 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)(this->theLCbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar22);
              pcVar21 = &local_e8;
              local_148.exp = local_e8.exp;
              local_148._72_8_ = local_e8._72_8_;
              goto LAB_002de575;
            }
            local_1d8[1] = local_148.data._M_elems[10];
            local_1d8[0] = local_148.data._M_elems[9];
            local_1f8._8_8_ = CONCAT44(local_148.data._M_elems[4],local_148.data._M_elems[3]);
            local_1f8._0_8_ = CONCAT44(local_148.data._M_elems[2],local_148.data._M_elems[1]);
            local_1e8._8_8_ = CONCAT44(local_148.data._M_elems[8],local_148.data._M_elems[7]);
            local_1e8._0_8_ = CONCAT44(local_148.data._M_elems[6],local_148.data._M_elems[5]);
            local_1d8[2] = local_148.data._M_elems[0xb];
            local_1d8[3] = local_148.data._M_elems[0xc];
            local_1d8[4] = local_148.data._M_elems[0xd];
            local_1d8[5] = local_148.data._M_elems[0xe];
            local_1d8[6] = (uint)(CONCAT35(local_148.data._M_elems[0xf]._1_3_,
                                           local_148.data._M_elems._56_5_) >> 0x20);
            pnVar6 = (this->theLCbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22) =
                 local_148.data._M_elems[0];
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 4);
            *puVar1 = CONCAT44(local_148.data._M_elems[2],local_148.data._M_elems[1]);
            puVar1[1] = CONCAT44(local_148.data._M_elems[4],local_148.data._M_elems[3]);
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x14);
            *puVar1 = CONCAT44(local_148.data._M_elems[6],local_148.data._M_elems[5]);
            puVar1[1] = CONCAT44(local_148.data._M_elems[8],local_148.data._M_elems[7]);
            puVar2 = (uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x24);
            *(undefined8 *)puVar2 = local_1d8._0_8_;
            *(ulong *)(puVar2 + 2) =
                 CONCAT44(local_148.data._M_elems[0xc],local_148.data._M_elems[0xb]);
            puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
            *puVar1 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
            puVar1[1] = CONCAT44(local_1d8[6],local_1d8[5]);
            *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_148.exp;
            *(char *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) =
                 (local_148.data._M_elems[0] != 0 || local_148.fpclass != cpp_dec_float_finite) ^
                 local_148.neg;
            *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) = local_148._72_8_
            ;
            bVar16 = boost::multiprecision::operator==
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_198,
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_148);
            if (bVar16) {
              local_1d8[5] = local_198.data._M_elems[0xe];
              local_1d8[6] = (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                             local_198.data._M_elems._56_5_) >> 0x20);
              pnVar6 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(uint *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22) =
                   local_198.data._M_elems[0];
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 4);
              *puVar1 = CONCAT44(local_198.data._M_elems[2],local_198.data._M_elems[1]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[4],local_198.data._M_elems[3]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x14);
              *puVar1 = CONCAT44(local_198.data._M_elems[6],local_198.data._M_elems[5]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[8],local_198.data._M_elems[7]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x24);
              *puVar1 = CONCAT44(local_198.data._M_elems[10],local_198.data._M_elems[9]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[0xc],local_198.data._M_elems[0xb]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
              *puVar1 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
              puVar1[1] = CONCAT44(local_1d8[6],local_1d8[5]);
              *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_198.exp;
              *(char *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) =
                   (local_198.data._M_elems[0] != 0 || local_198.fpclass != cpp_dec_float_finite) ^
                   local_198.neg;
              *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                   local_198._72_8_;
            }
          }
          else {
            local_1f8._4_4_ = local_198.data._M_elems[1];
            local_1f8._0_4_ = local_198.data._M_elems[0];
            local_1f8._12_4_ = local_198.data._M_elems[3];
            local_1f8._8_4_ = local_198.data._M_elems[2];
            local_1e8._4_4_ = local_198.data._M_elems[5];
            local_1e8._0_4_ = local_198.data._M_elems[4];
            local_1e8._12_4_ = local_198.data._M_elems[7];
            local_1e8._8_4_ = local_198.data._M_elems[6];
            local_1d8[1] = local_198.data._M_elems[9];
            local_1d8[0] = local_198.data._M_elems[8];
            local_1d8[4] = local_198.data._M_elems[0xc];
            local_1d8[5] = local_198.data._M_elems[0xd];
            local_1d8[6] = local_198.data._M_elems[0xe];
            local_1d8[7] = (uint)(CONCAT35(local_198.data._M_elems[0xf]._1_3_,
                                           local_198.data._M_elems._56_5_) >> 0x20);
            local_1d8[2] = local_198.data._M_elems[10];
            local_1d8[3] = local_198.data._M_elems[0xb];
            local_1d8[8] = local_198.exp;
            bStack_1b4 = local_198.neg;
            local_1b0._0_4_ = local_198.fpclass;
            local_1b0._4_4_ = local_198.prec_elem;
            if (local_198.fpclass != cpp_dec_float_finite || local_198.data._M_elems[0] != 0) {
              bStack_1b4 = (bool)(local_198.neg ^ 1);
            }
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theUCbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_1f8);
            if (tVar15) {
              pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)(this->theUCbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar22);
              local_e8.data._M_elems[1] = local_198.data._M_elems[1];
              local_e8.data._M_elems[0] = local_198.data._M_elems[0];
              local_e8.data._M_elems[3] = local_198.data._M_elems[3];
              local_e8.data._M_elems[2] = local_198.data._M_elems[2];
              local_e8.data._M_elems[5] = local_198.data._M_elems[5];
              local_e8.data._M_elems[4] = local_198.data._M_elems[4];
              local_e8.data._M_elems[7] = local_198.data._M_elems[7];
              local_e8.data._M_elems[6] = local_198.data._M_elems[6];
              local_e8.data._M_elems[9] = local_198.data._M_elems[9];
              local_e8.data._M_elems[8] = local_198.data._M_elems[8];
              local_e8.data._M_elems[0xb] = local_198.data._M_elems[0xb];
              local_e8.data._M_elems[10] = local_198.data._M_elems[10];
              local_e8.data._M_elems[0xd] = local_198.data._M_elems[0xd];
              local_e8.data._M_elems[0xc] = local_198.data._M_elems[0xc];
              local_e8.data._M_elems[0xf]._1_3_ = local_198.data._M_elems[0xf]._1_3_;
              local_e8.data._M_elems._56_5_ = local_198.data._M_elems._56_5_;
              local_e8.exp = local_198.exp;
              local_e8.neg = local_198.neg;
              local_e8.fpclass = local_198.fpclass;
              local_e8.prec_elem = local_198.prec_elem;
              if (local_198.fpclass != cpp_dec_float_finite || local_198.data._M_elems[0] != 0) {
                local_e8.neg = (bool)(local_198.neg ^ 1);
              }
              pcVar20 = &local_e8;
LAB_002de575:
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              bStack_1b4 = false;
              local_1d8[8] = 0;
              local_1d8[7] = 0;
              local_1d8[6] = 0;
              local_1d8[5] = 0;
              local_1d8[4] = 0;
              local_1d8[3] = 0;
              local_1d8[2] = 0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1e8 = (undefined1  [16])0x0;
              local_1f8 = (undefined1  [16])0x0;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,pcVar21,pcVar20);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
            else {
              local_1f8._4_4_ = local_148.data._M_elems[1];
              local_1f8._0_4_ = local_148.data._M_elems[0];
              local_1f8._12_4_ = local_148.data._M_elems[3];
              local_1f8._8_4_ = local_148.data._M_elems[2];
              local_1e8._4_4_ = local_148.data._M_elems[5];
              local_1e8._0_4_ = local_148.data._M_elems[4];
              local_1e8._12_4_ = local_148.data._M_elems[7];
              local_1e8._8_4_ = local_148.data._M_elems[6];
              local_1d8[1] = local_148.data._M_elems[9];
              local_1d8[0] = local_148.data._M_elems[8];
              local_1d8[4] = local_148.data._M_elems[0xc];
              local_1d8[5] = local_148.data._M_elems[0xd];
              local_1d8[6] = local_148.data._M_elems[0xe];
              local_1d8[7] = (uint)(CONCAT35(local_148.data._M_elems[0xf]._1_3_,
                                             local_148.data._M_elems._56_5_) >> 0x20);
              local_1d8[2] = local_148.data._M_elems[10];
              local_1d8[3] = local_148.data._M_elems[0xb];
              local_1d8[8] = local_148.exp;
              bStack_1b4 = local_148.neg;
              local_1b0._0_4_ = local_148.fpclass;
              local_1b0._4_4_ = local_148.prec_elem;
              if (local_148.fpclass != cpp_dec_float_finite || local_148.data._M_elems[0] != 0) {
                bStack_1b4 = (bool)(local_148.neg ^ 1);
              }
              tVar15 = boost::multiprecision::operator<
                                 ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)((long)(this->theLCbound).val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                            data._M_elems + lVar22),
                                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)local_1f8);
              if (tVar15) {
                local_e8.data._M_elems[1] = local_148.data._M_elems[1];
                local_e8.data._M_elems[0] = local_148.data._M_elems[0];
                local_e8.data._M_elems[3] = local_148.data._M_elems[3];
                local_e8.data._M_elems[2] = local_148.data._M_elems[2];
                local_e8.data._M_elems[5] = local_148.data._M_elems[5];
                local_e8.data._M_elems[4] = local_148.data._M_elems[4];
                local_e8.data._M_elems[7] = local_148.data._M_elems[7];
                local_e8.data._M_elems[6] = local_148.data._M_elems[6];
                local_e8.data._M_elems[9] = local_148.data._M_elems[9];
                local_e8.data._M_elems[8] = local_148.data._M_elems[8];
                local_e8.data._M_elems[0xb] = local_148.data._M_elems[0xb];
                local_e8.data._M_elems[10] = local_148.data._M_elems[10];
                local_e8.data._M_elems[0xd] = local_148.data._M_elems[0xd];
                local_e8.data._M_elems[0xc] = local_148.data._M_elems[0xc];
                local_e8.data._M_elems[0xf]._1_3_ = local_148.data._M_elems[0xf]._1_3_;
                local_e8.data._M_elems._56_5_ = local_148.data._M_elems._56_5_;
                local_e8.exp = local_148.exp;
                local_e8.neg = local_148.neg;
                local_e8.fpclass = local_148.fpclass;
                local_e8.prec_elem = local_148.prec_elem;
                if (local_148.fpclass != cpp_dec_float_finite || local_148.data._M_elems[0] != 0)
                goto LAB_002de527;
                goto LAB_002de530;
              }
            }
          }
          uVar23 = uVar23 - 1;
          lVar22 = lVar22 + -0x50;
        }
      }
      else {
        lVar22 = uVar23 * 0x50;
        while( true ) {
          pcVar20 = &local_198;
          pcVar21 = &local_148;
          if ((int)uVar23 < 1) break;
          pnVar6 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
          uVar7 = *puVar1;
          uVar8 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
          uVar9 = *puVar1;
          uVar10 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
          uVar11 = *puVar1;
          uVar12 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
          uVar13 = *puVar1;
          uVar14 = puVar1[1];
          local_198.data._M_elems[0xc] = (uint)uVar13;
          local_198.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
          local_198.data._M_elems._56_5_ = SUB85(uVar14,0);
          local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
          local_198.data._M_elems[8] = (uint)uVar11;
          local_198.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
          local_198.data._M_elems[10] = (uint)uVar12;
          local_198.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
          local_198.data._M_elems[4] = (uint)uVar9;
          local_198.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
          local_198.data._M_elems[6] = (uint)uVar10;
          local_198.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
          local_198.data._M_elems[0] = (uint)uVar7;
          local_198.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
          local_198.data._M_elems[2] = (uint)uVar8;
          local_198.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
          local_198.exp = *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22);
          local_198.neg = *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U);
          local_198._72_8_ = *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U);
          pnVar6 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
          uVar7 = *puVar1;
          uVar8 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
          uVar9 = *puVar1;
          uVar10 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
          uVar11 = *puVar1;
          uVar12 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
          uVar13 = *puVar1;
          uVar14 = puVar1[1];
          local_148.data._M_elems[0xc] = (uint)uVar13;
          local_148.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
          local_148.data._M_elems._56_5_ = SUB85(uVar14,0);
          local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
          local_148.data._M_elems[8] = (uint)uVar11;
          local_148.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
          local_148.data._M_elems[10] = (uint)uVar12;
          local_148.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
          local_148.data._M_elems[4] = (uint)uVar9;
          local_148.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
          local_148.data._M_elems[6] = (uint)uVar10;
          local_148.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
          local_148.data._M_elems[0] = (uint)uVar7;
          local_148.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
          local_148.data._M_elems[2] = (uint)uVar8;
          local_148.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
          local_148.exp = *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22);
          local_148.neg = *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U);
          local_148._72_8_ = *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U);
          bVar16 = boost::multiprecision::operator==
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)pcVar20,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)pcVar21);
          if (bVar16) {
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theURbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)pcVar20);
            if (tVar15) {
LAB_002de6cb:
              pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)(this->theURbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar22);
            }
            else {
LAB_002de7f7:
              pcVar20 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)(this->theLRbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar22);
            }
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            bStack_1b4 = false;
            local_1d8[8] = 0;
            local_1d8[7] = 0;
            local_1d8[6] = 0;
            local_1d8[5] = 0;
            local_1d8[4] = 0;
            local_1d8[3] = 0;
            local_1d8[2] = 0;
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1e8 = (undefined1  [16])0x0;
            local_1f8 = (undefined1  [16])0x0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,pcVar21,pcVar20);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
          }
          else if (this->theRep *
                   (this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thedesc.rowstat.data[uVar23 - 1] < 1) {
            pnVar6 = (this->thePvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = (undefined1  [16])0x0;
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1d8[2] = 0;
            local_1d8[3] = 0;
            local_1d8[4] = 0;
            local_1d8[5] = 0;
            local_1d8[6] = 0;
            local_1d8[7] = 0;
            local_1d8[8] = 0;
            bStack_1b4 = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,pcVar20,&local_80);
            tVar15 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar6[0xffffffffffffffff].m_backend.data._M_elems +
                                   lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_1f8);
            if (tVar15) {
              pnVar6 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
              *puVar1 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
              puVar1[1] = CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_
                                  );
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
              *puVar1 = CONCAT44(local_198.data._M_elems[9],local_198.data._M_elems[8]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[0xb],local_198.data._M_elems[10]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
              *puVar1 = CONCAT44(local_198.data._M_elems[5],local_198.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[7],local_198.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
              *puVar1 = CONCAT44(local_198.data._M_elems[1],local_198.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[3],local_198.data._M_elems[2]);
              *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_198.exp;
              *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) = local_198.neg;
              *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                   local_198._72_8_;
            }
            else {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theURbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22),pcVar20);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
            pnVar6 = (this->thePvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = (undefined1  [16])0x0;
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1d8[2] = 0;
            local_1d8[3] = 0;
            local_1d8[4] = 0;
            local_1d8[5] = 0;
            local_1d8[6] = 0;
            local_1d8[7] = 0;
            local_1d8[8] = 0;
            bStack_1b4 = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_148,&local_80);
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar6[0xffffffffffffffff].m_backend.data._M_elems +
                                   lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_1f8);
            if (tVar15) {
              pnVar6 = (this->theLRbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
              *puVar1 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
              puVar1[1] = CONCAT35(local_148.data._M_elems[0xf]._1_3_,local_148.data._M_elems._56_5_
                                  );
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
              *puVar1 = CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
              *puVar1 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
              *puVar1 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
              *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_148.exp;
              *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) = local_148.neg;
              *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                   local_148._72_8_;
            }
            else {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_148,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theLRbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22));
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
          }
          else {
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theURbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)pcVar20);
            if (tVar15) goto LAB_002de6cb;
            tVar15 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theLRbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)pcVar21);
            if (tVar15) goto LAB_002de7f7;
          }
          uVar23 = uVar23 - 1;
          lVar22 = lVar22 + -0x50;
        }
        uVar23 = (ulong)(uint)(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
        lVar22 = uVar23 * 0x50;
        while( true ) {
          pcVar21 = &local_198;
          pcVar20 = &local_148;
          if ((int)uVar23 < 1) break;
          pnVar6 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
          uVar7 = *puVar1;
          uVar8 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
          uVar9 = *puVar1;
          uVar10 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
          uVar11 = *puVar1;
          uVar12 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
          uVar13 = *puVar1;
          uVar14 = puVar1[1];
          local_198.data._M_elems[0xc] = (uint)uVar13;
          local_198.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
          local_198.data._M_elems._56_5_ = SUB85(uVar14,0);
          local_198.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
          local_198.data._M_elems[8] = (uint)uVar11;
          local_198.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
          local_198.data._M_elems[10] = (uint)uVar12;
          local_198.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
          local_198.data._M_elems[4] = (uint)uVar9;
          local_198.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
          local_198.data._M_elems[6] = (uint)uVar10;
          local_198.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
          local_198.data._M_elems[0] = (uint)uVar7;
          local_198.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
          local_198.data._M_elems[2] = (uint)uVar8;
          local_198.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
          local_198.exp = *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22);
          local_198.neg = *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U);
          local_198._72_8_ = *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U);
          pnVar6 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
          uVar7 = *puVar1;
          uVar8 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
          uVar9 = *puVar1;
          uVar10 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
          uVar11 = *puVar1;
          uVar12 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
          uVar13 = *puVar1;
          uVar14 = puVar1[1];
          local_148.data._M_elems[0xc] = (uint)uVar13;
          local_148.data._M_elems[0xd] = (uint)((ulong)uVar13 >> 0x20);
          local_148.data._M_elems._56_5_ = SUB85(uVar14,0);
          local_148.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar14 >> 0x28);
          local_148.data._M_elems[8] = (uint)uVar11;
          local_148.data._M_elems[9] = (uint)((ulong)uVar11 >> 0x20);
          local_148.data._M_elems[10] = (uint)uVar12;
          local_148.data._M_elems[0xb] = (uint)((ulong)uVar12 >> 0x20);
          local_148.data._M_elems[4] = (uint)uVar9;
          local_148.data._M_elems[5] = (uint)((ulong)uVar9 >> 0x20);
          local_148.data._M_elems[6] = (uint)uVar10;
          local_148.data._M_elems[7] = (uint)((ulong)uVar10 >> 0x20);
          local_148.data._M_elems[0] = (uint)uVar7;
          local_148.data._M_elems[1] = (uint)((ulong)uVar7 >> 0x20);
          local_148.data._M_elems[2] = (uint)uVar8;
          local_148.data._M_elems[3] = (uint)((ulong)uVar8 >> 0x20);
          local_148.exp = *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22);
          local_148.neg = *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U);
          local_148._72_8_ = *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U);
          bVar16 = boost::multiprecision::operator==
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)pcVar21,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)pcVar20);
          if (bVar16) {
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theUCbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)pcVar21);
            if (tVar15) {
              pnVar6 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
LAB_002deb53:
              pcVar20 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
            }
            else {
              pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)(this->theLCbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar22);
            }
LAB_002decd4:
            local_1d8[7] = 0;
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            bStack_1b4 = false;
            local_1d8[8] = 0;
            local_1d8[6] = 0;
            local_1d8[5] = 0;
            local_1d8[4] = 0;
            local_1d8[3] = 0;
            local_1d8[2] = 0;
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1e8 = (undefined1  [16])0x0;
            local_1f8 = (undefined1  [16])0x0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,pcVar20,pcVar21);
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                      (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
          }
          else if (this->theRep *
                   (this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thedesc.colstat.data[uVar23 - 1] < 1) {
            pnVar6 = (this->theCoPvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = (undefined1  [16])0x0;
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1d8[2] = 0;
            local_1d8[3] = 0;
            local_1d8[4] = 0;
            local_1d8[5] = 0;
            local_1d8[6] = 0;
            local_1d8[7] = 0;
            local_1d8[8] = 0;
            bStack_1b4 = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,pcVar21,&local_80);
            tVar15 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar6[0xffffffffffffffff].m_backend.data._M_elems +
                                   lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_1f8);
            if (tVar15) {
              pnVar6 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
              *puVar1 = CONCAT44(local_198.data._M_elems[0xd],local_198.data._M_elems[0xc]);
              puVar1[1] = CONCAT35(local_198.data._M_elems[0xf]._1_3_,local_198.data._M_elems._56_5_
                                  );
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
              *puVar1 = CONCAT44(local_198.data._M_elems[9],local_198.data._M_elems[8]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[0xb],local_198.data._M_elems[10]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
              *puVar1 = CONCAT44(local_198.data._M_elems[5],local_198.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[7],local_198.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
              *puVar1 = CONCAT44(local_198.data._M_elems[1],local_198.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_198.data._M_elems[3],local_198.data._M_elems[2]);
              *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_198.exp;
              *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) = local_198.neg;
              *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                   local_198._72_8_;
            }
            else {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theUCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22),pcVar21);
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
            pnVar6 = (this->theCoPvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_1b0._0_4_ = cpp_dec_float_finite;
            local_1b0._4_4_ = 0x10;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = (undefined1  [16])0x0;
            local_1d8[0] = 0;
            local_1d8[1] = 0;
            local_1d8[2] = 0;
            local_1d8[3] = 0;
            local_1d8[4] = 0;
            local_1d8[5] = 0;
            local_1d8[6] = 0;
            local_1d8[7] = 0;
            local_1d8[8] = 0;
            bStack_1b4 = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_148,&local_80);
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)pnVar6[0xffffffffffffffff].m_backend.data._M_elems +
                                   lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)local_1f8);
            if (tVar15) {
              pnVar6 = (this->theLCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x30);
              *puVar1 = CONCAT44(local_148.data._M_elems[0xd],local_148.data._M_elems[0xc]);
              puVar1[1] = CONCAT35(local_148.data._M_elems[0xf]._1_3_,local_148.data._M_elems._56_5_
                                  );
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x20);
              *puVar1 = CONCAT44(local_148.data._M_elems[9],local_148.data._M_elems[8]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[0xb],local_148.data._M_elems[10]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22 + 0x10);
              *puVar1 = CONCAT44(local_148.data._M_elems[5],local_148.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[7],local_148.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar6[-1].m_backend.data._M_elems + lVar22);
              *puVar1 = CONCAT44(local_148.data._M_elems[1],local_148.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_148.data._M_elems[3],local_148.data._M_elems[2]);
              *(int *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22) = local_148.exp;
              *(bool *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 4U) = local_148.neg;
              *(undefined8 *)((long)(&pnVar6[-1].m_backend.data + 1) + lVar22 + 8U) =
                   local_148._72_8_;
            }
            else {
              local_1b0._0_4_ = cpp_dec_float_finite;
              local_1b0._4_4_ = 0x10;
              local_1f8 = (undefined1  [16])0x0;
              local_1e8 = (undefined1  [16])0x0;
              local_1d8[0] = 0;
              local_1d8[1] = 0;
              local_1d8[2] = 0;
              local_1d8[3] = 0;
              local_1d8[4] = 0;
              local_1d8[5] = 0;
              local_1d8[6] = 0;
              local_1d8[7] = 0;
              local_1d8[8] = 0;
              bStack_1b4 = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                        ((cpp_dec_float<100U,_int,_void> *)local_1f8,&local_148,
                         (cpp_dec_float<100U,_int,_void> *)
                         ((long)(this->theLCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar22));
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        (local_1a0,(cpp_dec_float<100U,_int,_void> *)local_1f8);
            }
          }
          else {
            tVar15 = boost::multiprecision::operator>
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theUCbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)pcVar21);
            if (tVar15) {
              pnVar6 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_002deb53;
            }
            tVar15 = boost::multiprecision::operator<
                               ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)((long)(this->theLCbound).val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                          data._M_elems + lVar22),
                                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_148);
            if (tVar15) {
              pcVar21 = (cpp_dec_float<100U,_int,_void> *)
                        ((long)(this->theLCbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar22);
              pcVar20 = &local_148;
              goto LAB_002decd4;
            }
          }
          uVar23 = uVar23 - 1;
          lVar22 = lVar22 + -0x50;
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::unShift(void)
{
   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "DSHIFT07 = " << "unshifting ..." << std::endl;);

   if(isInitialized())
   {
      int i;
      R t_up, t_low;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      theShift = 0;

      if(type() == ENTER)
      {
         R eps = entertol();

         if(rep() == COLUMN)
         {
            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);

               if(l_id.type() == SPxId::ROW_ID)
               {
                  t_up = -this->lhs(l_num);
                  t_low = -this->rhs(l_num);
               }
               else
               {
                  assert(l_id.type() == SPxId::COL_ID);
                  t_up = this->upper(l_num);
                  t_low = this->lower(l_num);
               }

               if(t_up != t_low)
               {
                  if((*theFvec)[i] < t_up + eps)  // check allowed violation
                     theUBbound[i] = t_up; // reset shifted bound to original
                  else if((*theFvec)[i] > t_up)  // shifted bound is required for feasibility
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low - eps)  // check allowed violation
                     theLBbound[i] = t_low; // reset shifted bound to original
                  else if((*theFvec)[i] < t_low)  // shifted bound is required for feasibility
                     theShift -= theLBbound[i] - t_low;
               }
               else
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else if(theLBbound[i] < t_low)
                     theShift += t_low - theLBbound[i];
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = -this->lhs(i);
                  t_low = -this->rhs(i);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = this->upper(i);
                  t_low = this->lower(i);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);
               t_up = t_low = 0;

               if(l_id.type() == SPxId::ROW_ID)
                  clearDualBounds(ds.rowStatus(l_num), t_up, t_low);
               else
                  clearDualBounds(ds.colStatus(l_num), t_up, t_low);

               if(theUBbound[i] != theLBbound[i])
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else
                     theShift -= theUBbound[i] - t_up;
               }
               else
               {
                  /* if the basic (primal or dual) variable is fixed (e.g., basis status P_FREE in row representation)
                   * then shiftFvec() and shiftPvec() do not relax the bounds, but shift both, hence they may be outside
                   * of [t_low,t_up] */
                  assert(theLBbound[i] == theUBbound[i] || theUBbound[i] >= t_up);
                  assert(theLBbound[i] == theUBbound[i] || theLBbound[i] <= t_low);

                  if((*theFvec)[i] < t_up - eps)
                     theUBbound[i] = t_up;
                  else if((*theFvec)[i] > t_up)
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low + eps)
                     theLBbound[i] = t_low;
                  else if((*theFvec)[i] < t_low)
                     theShift -= theLBbound[i] - t_low;
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.rowStatus(i), t_up, t_low);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.colStatus(i), t_up, t_low);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
      }
      else
      {
         assert(type() == LEAVE);

         R eps = leavetol();

         if(rep() == COLUMN)
         {
            for(i = this->nRows(); i-- > 0;)
            {
               t_up = t_low = this->maxRowObj(i);
               clearDualBounds(ds.rowStatus(i), t_up, t_low);

               if(!isBasic(ds.rowStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                  {
                     theURbound[i] = t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLRbound[i] = t_low; // for fixed rows we change both bounds
                  }
                  else
                     theShift += theURbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                  {
                     theLRbound[i] = t_low; // reset bound to original value

                     if(t_up == t_low)
                        theURbound[i] = t_up; // for fixed rows we change both bounds
                  }
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = t_low = -this->maxObj(i);
               clearDualBounds(ds.colStatus(i), t_low, t_up);

               if(!isBasic(ds.colStatus(i)))
               {
                  if((*thePvec)[i] < -t_up + eps)
                  {
                     theUCbound[i] = -t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLCbound[i] = -t_low; // for fixed variables we change both bounds
                  }
                  else
                     theShift += theUCbound[i] - (-t_up);

                  if((*thePvec)[i] > -t_low - eps)
                  {
                     theLCbound[i] = -t_low; // reset bound to original value

                     if(t_up == t_low)
                        theUCbound[i] = -t_up; // for fixed variables we change both bounds
                  }
                  else
                     theShift += (-t_low) - theLCbound[i];
               }
               else if(theUCbound[i] > -t_up)
                  theShift += theUCbound[i] - (-t_up);
               else if(theLCbound[i] < -t_low)
                  theShift += (-t_low) - theLCbound[i];
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = this->nRows(); i-- > 0;)
            {
               t_up = this->rhs(i);
               t_low = this->lhs(i);

               if(t_up == t_low)
               {
                  if(theURbound[i] > t_up)
                     theShift += theURbound[i] - t_up;
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(!isBasic(ds.rowStatus(i)))
               {
                  if((*thePvec)[i] < t_up + eps)
                     theURbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theURbound[i] - t_up;

                  if((*thePvec)[i] > t_low - eps)
                     theLRbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = this->upper(i);
               t_low = this->lower(i);

               if(t_up == t_low)
               {
                  if(theUCbound[i] > t_up)
                     theShift += theUCbound[i] - t_up;
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(!isBasic(ds.colStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                     theUCbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theUCbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                     theLCbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(theUCbound[i] > t_up)
                  theShift += theUCbound[i] - t_up;
               else if(theLCbound[i] < t_low)
                  theShift += t_low - theLCbound[i];
            }
         }
      }
   }
}